

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

llama_perf_sampler_data llama_perf_sampler(llama_sampler *chain)

{
  uint uVar1;
  llama_sampler_i *in_RAX;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  llama_perf_sampler_data lVar3;
  
  if ((chain != (llama_sampler *)0x0) &&
     (in_RAX = &llama_sampler_chain_i, chain->iface == &llama_sampler_chain_i)) {
    lVar3.t_sample_ms = (double)*(long *)((long)chain->ctx + 0x20) * 0.001;
    uVar1 = *(uint *)((long)chain->ctx + 0x28);
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    lVar3._8_8_ = uVar2;
    return lVar3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0x9e8,
             "%s: invalid sampler passed - requires a sampler created with llama_sampler_chain_init()\n"
             ,"llama_perf_sampler",in_R8,in_R9,in_RAX);
}

Assistant:

struct llama_perf_sampler_data llama_perf_sampler(const struct llama_sampler * chain) {
    struct llama_perf_sampler_data data = {};

    if (chain == nullptr || chain->iface != &llama_sampler_chain_i) {
        GGML_ABORT("%s: invalid sampler passed - requires a sampler created with llama_sampler_chain_init()\n", __func__);
    }

    const auto * ctx = (const struct llama_sampler_chain *) chain->ctx;

    data.t_sample_ms = 1e-3 * ctx->t_sample_us;
    data.n_sample    = std::max(0, ctx->n_sample);

    return data;
}